

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

int __thiscall amrex::ParmParse::countname(ParmParse *this,string *name)

{
  _List_node_base *p_Var1;
  bool bVar2;
  _List_node_base *p_Var3;
  int iVar4;
  string local_50;
  
  p_Var1 = (_List_node_base *)this->m_table;
  p_Var3 = p_Var1->_M_next;
  if (p_Var3 == p_Var1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      prefixedName(&local_50,this,name);
      bVar2 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var3 + 1),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar4 = iVar4 + (uint)bVar2;
      p_Var3 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != p_Var1);
  }
  return iVar4;
}

Assistant:

int
ParmParse::countname (const std::string& name) const
{
    int cnt = 0;
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
        if ( ppfound(prefixedName(name), *li, false) )
        {
            cnt++;
        }
    }
    return cnt;
}